

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall pfederc::ArrayCpyExpr::~ArrayCpyExpr(ArrayCpyExpr *this)

{
  ArrayCpyExpr *this_local;
  
  ~ArrayCpyExpr(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

ArrayCpyExpr::~ArrayCpyExpr() {
}